

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

int Gia_ManConeMark_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vRoots,int nLimit)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int nLimit_local;
  Vec_Int_t *vRoots_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 != 0) {
    return 0;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsCo(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsRo(p,pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsPi(p,pObj);
        if (iVar1 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCone.c"
                        ,0xf3,"int Gia_ManConeMark_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)")
          ;
        }
      }
      else {
        pGVar2 = Gia_ObjRoToRi(p,pObj);
        iVar1 = Gia_ObjId(p,pGVar2);
        Vec_IntPush(vRoots,iVar1);
      }
    }
    else {
      pGVar2 = Gia_ObjFanin0(pObj);
      iVar1 = Gia_ManConeMark_rec(p,pGVar2,vRoots,nLimit);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  else {
    pGVar2 = Gia_ObjFanin0(pObj);
    iVar1 = Gia_ManConeMark_rec(p,pGVar2,vRoots,nLimit);
    if (iVar1 != 0) {
      return 1;
    }
    pGVar2 = Gia_ObjFanin1(pObj);
    iVar1 = Gia_ManConeMark_rec(p,pGVar2,vRoots,nLimit);
    if (iVar1 != 0) {
      return 1;
    }
  }
  iVar1 = Vec_IntSize(vRoots);
  return (uint)(nLimit < iVar1);
}

Assistant:

int Gia_ManConeMark_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vRoots, int nLimit )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin0(pObj), vRoots, nLimit ) )
            return 1;
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin1(pObj), vRoots, nLimit ) )
            return 1;
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        if ( Gia_ManConeMark_rec( p, Gia_ObjFanin0(pObj), vRoots, nLimit ) )
            return 1;
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
    else if ( Gia_ObjIsPi(p, pObj) )
    {}
    else assert( 0 );
    return (int)(Vec_IntSize(vRoots) > nLimit);
}